

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_eigen.hpp
# Opt level: O1

Tensor<2> * Omega_h::exp_spd_old<2>(Tensor<2> m)

{
  Vector<2> *pVVar1;
  double dVar2;
  Int i_3;
  int iVar3;
  long lVar4;
  double *pdVar5;
  Int i_6;
  undefined8 uVar6;
  double *pdVar7;
  Int i;
  long lVar8;
  long lVar9;
  Tensor<2> *in_RDI;
  char *pcVar10;
  bool bVar11;
  uint uVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double in_stack_00000008;
  Matrix<2,_2> c;
  Matrix<2,_2> ta;
  Vector<2> c_1;
  Real b;
  Real c_2;
  Vector<2> l;
  Matrix<2,_2> b_2;
  Tensor<2> a_1;
  double local_178 [13];
  double local_110;
  double local_108 [9];
  undefined8 uStack_c0;
  double local_b8;
  undefined8 uStack_b0;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  double local_78 [10];
  
  pdVar5 = local_178 + 6;
  local_178[6] = in_stack_00000008;
  local_178[7] = c.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[0];
  local_178[8] = c.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[1];
  local_178[9] = c.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[0];
  dVar15 = 0.0;
  lVar4 = 0;
  do {
    lVar8 = 0;
    dVar13 = dVar15;
    do {
      dVar15 = ABS(pdVar5[lVar8]);
      if (ABS(pdVar5[lVar8]) <= dVar13) {
        dVar15 = dVar13;
      }
      lVar8 = lVar8 + 1;
      dVar13 = dVar15;
    } while (lVar8 == 1);
    pdVar5 = pdVar5 + 2;
    bVar11 = lVar4 == 0;
    lVar4 = lVar4 + 1;
  } while (bVar11);
  if (dVar15 <= 1e-10) {
    pdVar5 = local_178 + 6;
    lVar4 = 0;
    do {
      lVar8 = 0;
      do {
        uVar12 = 0x3ff00000;
        if (lVar4 != lVar8) {
          uVar12 = 0;
        }
        pdVar5[lVar8] = (double)((ulong)uVar12 << 0x20);
        lVar8 = lVar8 + 1;
      } while (lVar8 == 1);
      pdVar5 = pdVar5 + 2;
      bVar11 = lVar4 == 0;
      lVar4 = lVar4 + 1;
    } while (bVar11);
    local_178[10] = 0.0;
    local_178[0xb] = 0.0;
  }
  else {
    lVar4 = 0;
    do {
      local_178[0] = local_178[lVar4 * 2 + 6];
      local_178[1] = local_178[lVar4 * 2 + 7];
      lVar8 = 0;
      do {
        local_108[lVar8] = local_178[lVar8] / dVar15;
        dVar13 = local_108[1];
        lVar8 = lVar8 + 1;
      } while (lVar8 == 1);
      local_178[lVar4 * 2 + 2] = local_108[0];
      local_178[lVar4 * 2 + 3] = dVar13;
      bVar11 = lVar4 == 0;
      lVar4 = lVar4 + 1;
    } while (bVar11);
    dVar2 = local_178[5] + local_178[2];
    local_88 = local_178[3];
    local_90 = local_178[4];
    local_80 = local_178[2];
    local_98 = local_178[5];
    dVar14 = (local_178[2] * local_178[5] - local_178[3] * local_178[4]) * -4.0 + dVar2 * dVar2;
    dVar13 = ABS(dVar14);
    local_108[6] = dVar15;
    local_108[7] = 0.0;
    if (5e-05 <= dVar13) {
      iVar3 = 0;
      local_108[4] = 0.0;
      local_108[5] = 0.0;
      if (0.0 < dVar14) {
        dVar15 = SQRT(dVar14);
        local_108[8] = dVar13;
        uStack_c0 = 0;
        local_110 = dVar2;
        dVar13 = dVar15;
        if (dVar14 < 0.0) {
          uStack_b0 = 0;
          local_b8 = dVar14;
          local_a0 = dVar15;
          dVar15 = sqrt(dVar14);
          dVar14 = local_b8;
          dVar13 = local_a0;
        }
        local_108[4] = dVar15 + local_110;
        if (dVar14 < 0.0) {
          local_b8 = dVar15 + local_110;
          dVar13 = sqrt(dVar14);
          local_108[4] = local_b8;
        }
        local_108[4] = local_108[4] * 0.5;
        local_108[5] = (local_110 - dVar13) * 0.5;
        iVar3 = 2;
        dVar13 = local_108[8];
      }
    }
    else {
      local_108[4] = dVar2 * 0.5;
      iVar3 = 1;
      local_108[5] = local_108[4];
    }
    dVar15 = local_108[6];
    uVar6 = 0x119;
    pcVar10 = "nroots == 1 && roots_obj.mults[0] == 2";
    if (iVar3 == 1) {
      if (5e-05 <= dVar13) goto LAB_0036124e;
      local_78[1] = local_108[4];
      local_78[0] = local_108[4];
      pdVar5 = local_178 + 6;
      lVar4 = 0;
      do {
        lVar8 = 0;
        do {
          uVar12 = 0x3ff00000;
          if (lVar4 != lVar8) {
            uVar12 = 0;
          }
          pdVar5[lVar8] = (double)((ulong)uVar12 << 0x20);
          lVar8 = lVar8 + 1;
        } while (lVar8 == 1);
        pdVar5 = pdVar5 + 2;
        bVar11 = lVar4 == 0;
        lVar4 = lVar4 + 1;
      } while (bVar11);
      local_108[2] = local_178[8];
      local_108[3] = local_178[9];
      local_108[0] = local_178[6];
      local_108[1] = local_178[7];
    }
    else {
      if (iVar3 != 2) {
LAB_0036124e:
        fail("assertion %s failed at %s +%d\n",pcVar10,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_eigen.hpp"
             ,uVar6);
      }
      pcVar10 = "best_norm > EPSILON";
      lVar4 = 0;
      do {
        dVar15 = local_108[lVar4 + 4];
        local_178[6] = local_80;
        local_178[7] = local_88;
        local_178[8] = local_90;
        local_178[9] = local_98;
        lVar8 = 0;
        pdVar5 = local_178 + 6;
        do {
          *pdVar5 = *pdVar5 - dVar15;
          lVar8 = lVar8 + 0x10;
          pdVar5 = pdVar5 + 3;
        } while (lVar8 == 0x10);
        local_108[8] = dVar15;
        local_178[4] = local_178[8];
        local_178[5] = local_178[9];
        local_178[2] = local_178[6];
        local_178[3] = local_178[7];
        pdVar5 = local_178 + 2;
        pdVar7 = local_178 + 6;
        lVar8 = 0;
        do {
          lVar9 = 0;
          do {
            *(undefined8 *)((long)pdVar7 + lVar9) = *(undefined8 *)((long)pdVar5 + lVar9 * 2);
            lVar9 = lVar9 + 8;
          } while (lVar9 == 8);
          pdVar7 = pdVar7 + 2;
          pdVar5 = pdVar5 + 1;
          bVar11 = lVar8 == 0;
          lVar8 = lVar8 + 1;
        } while (bVar11);
        dVar13 = local_178[7] * local_178[7] + local_178[6] * local_178[6];
        if (dVar13 < 0.0) {
          dVar13 = sqrt(dVar13);
        }
        else {
          dVar13 = SQRT(dVar13);
        }
        dVar2 = local_178[9] * local_178[9] + local_178[8] * local_178[8];
        if (dVar2 < 0.0) {
          local_110 = dVar13;
          dVar2 = sqrt(dVar2);
          dVar13 = local_110;
        }
        else {
          dVar2 = SQRT(dVar2);
        }
        dVar15 = local_108[6];
        dVar14 = dVar2;
        if (dVar2 <= dVar13) {
          dVar14 = dVar13;
        }
        if (dVar14 <= 1e-10) {
          uVar6 = 0xd3;
          goto LAB_0036124e;
        }
        local_178[0] = local_178[(ulong)(dVar13 < dVar2) * 2 + 6];
        local_178[1] = local_178[(ulong)(dVar13 < dVar2) * 2 + 7];
        lVar8 = 0;
        do {
          local_178[lVar8 + 2] = local_178[lVar8] / dVar14;
          lVar8 = lVar8 + 1;
        } while (lVar8 == 1);
        local_108[lVar4 * 2] = -local_178[3];
        local_108[lVar4 * 2 + 1] = local_178[2];
        local_78[lVar4] = local_108[8];
        bVar11 = lVar4 == 0;
        lVar4 = lVar4 + 1;
      } while (bVar11);
    }
    local_178[8] = local_108[2];
    local_178[9] = local_108[3];
    local_178[6] = local_108[0];
    local_178[7] = local_108[1];
    local_108[0] = local_78[0];
    local_108[1] = local_78[1];
    lVar4 = 0;
    do {
      local_178[lVar4 + 2] = local_108[lVar4] * dVar15;
      lVar4 = lVar4 + 1;
    } while (lVar4 == 1);
    local_178[10] = local_178[2];
    local_178[0xb] = local_178[3];
  }
  lVar4 = 4;
  do {
    dVar15 = exp(local_178[lVar4 + 6]);
    local_178[lVar4 + 6] = dVar15;
    lVar4 = lVar4 + 1;
  } while (lVar4 == 5);
  local_178[2] = local_178[10];
  local_178[3] = local_178[0xb];
  pdVar5 = local_78 + 6;
  local_78[7] = 0.0;
  local_78[8] = 0.0;
  lVar4 = 0;
  do {
    *pdVar5 = local_178[lVar4 + 2];
    lVar4 = lVar4 + 1;
    pdVar5 = pdVar5 + 3;
  } while (lVar4 == 1);
  lVar4 = 0;
  do {
    dVar15 = local_78[lVar4 * 2 + 6];
    dVar13 = local_78[lVar4 * 2 + 7];
    local_178[0] = local_178[6];
    local_178[1] = local_178[7];
    lVar8 = 0;
    do {
      local_178[lVar8 + 2] = local_178[lVar8] * dVar15;
      dVar14 = local_178[3];
      dVar2 = local_178[2];
      lVar8 = lVar8 + 1;
    } while (lVar8 == 1);
    local_178[0] = local_178[8];
    local_178[1] = local_178[9];
    lVar8 = 0;
    do {
      local_178[lVar8 + 2] = local_178[lVar8] * dVar13;
      lVar8 = lVar8 + 1;
    } while (lVar8 == 1);
    local_178[0] = dVar2;
    local_178[1] = dVar14;
    local_108[4] = local_178[2];
    local_108[5] = local_178[3];
    lVar8 = 0;
    do {
      local_178[lVar8 + 2] = local_178[lVar8] + local_108[lVar8 + 4];
      lVar8 = lVar8 + 1;
    } while (lVar8 == 1);
    local_108[lVar4 * 2] = local_178[2];
    local_108[lVar4 * 2 + 1] = local_178[3];
    bVar11 = lVar4 == 0;
    lVar4 = lVar4 + 1;
  } while (bVar11);
  pdVar5 = local_178 + 2;
  local_178[2] = local_178[6];
  local_178[3] = local_178[7];
  local_178[4] = local_178[8];
  local_178[5] = local_178[9];
  pdVar7 = local_78;
  lVar4 = 0;
  do {
    pdVar7 = pdVar7 + 2;
    lVar8 = 0;
    do {
      *(undefined8 *)((long)pdVar7 + lVar8) = *(undefined8 *)((long)pdVar5 + lVar8 * 2);
      lVar8 = lVar8 + 8;
    } while (lVar8 == 8);
    pdVar5 = pdVar5 + 1;
    bVar11 = lVar4 == 0;
    lVar4 = lVar4 + 1;
  } while (bVar11);
  lVar4 = 0;
  do {
    dVar15 = local_78[lVar4 * 2 + 2];
    dVar13 = local_78[lVar4 * 2 + 3];
    local_178[0] = local_108[0];
    local_178[1] = local_108[1];
    lVar8 = 0;
    do {
      local_178[lVar8 + 2] = local_178[lVar8] * dVar15;
      dVar14 = local_178[3];
      dVar2 = local_178[2];
      lVar8 = lVar8 + 1;
    } while (lVar8 == 1);
    local_178[0] = local_108[2];
    local_178[1] = local_108[3];
    lVar8 = 0;
    do {
      local_178[lVar8 + 2] = local_178[lVar8] * dVar13;
      lVar8 = lVar8 + 1;
    } while (lVar8 == 1);
    local_178[0] = dVar2;
    local_178[1] = dVar14;
    local_108[4] = local_178[2];
    local_108[5] = local_178[3];
    lVar8 = 0;
    do {
      local_178[lVar8 + 2] = local_178[lVar8] + local_108[lVar8 + 4];
      lVar8 = lVar8 + 1;
    } while (lVar8 == 1);
    pVVar1 = (in_RDI->super_Few<Omega_h::Vector<2>,_2>).array_ + lVar4;
    (pVVar1->super_Few<double,_2>).array_[0] = local_178[2];
    (pVVar1->super_Few<double,_2>).array_[1] = local_178[3];
    bVar11 = lVar4 == 0;
    lVar4 = lVar4 + 1;
  } while (bVar11);
  return in_RDI;
}

Assistant:

OMEGA_H_INLINE_BIG Tensor<dim> exp_spd_old(
    Tensor<dim> const m) OMEGA_H_NOEXCEPT {
  auto decomp = decompose_eigen(m);
  for (Int i = 0; i < dim; ++i) decomp.l[i] = std::exp(decomp.l[i]);
  return compose_ortho(decomp.q, decomp.l);
}